

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O1

vector<Patch::Change,_std::allocator<Patch::Change>_> * __thiscall
Patch::grab_changes_in_range<Patch::OldCoordinates>
          (vector<Patch::Change,_std::allocator<Patch::Change>_> *__return_storage_ptr__,Patch *this
          ,Point start,Point end,bool inclusive)

{
  pointer *ppPVar1;
  vector<Patch::Node_*,_std::allocator<Patch::Node_*>_> *this_00;
  pointer *pppNVar2;
  pointer ppNVar3;
  iterator iVar4;
  iterator iVar5;
  Text *pTVar6;
  iterator __position;
  pointer ppNVar7;
  bool bVar8;
  bool bVar9;
  uint32_t uVar10;
  Node *pNVar11;
  Point PVar12;
  pointer ppNVar13;
  pointer pPVar14;
  undefined7 in_register_00000081;
  Point new_start;
  Point old_start;
  Change change;
  Node *local_e0;
  vector<Patch::Change,std::allocator<Patch::Change>> *local_d8;
  PositionStackEntry local_d0;
  Text *local_b8;
  undefined4 local_b0;
  uint32_t local_ac;
  Point local_a8;
  Point local_a0;
  Point local_98;
  Point local_90;
  Point local_88;
  Change local_80;
  Point local_40;
  Point local_38;
  
  local_b0 = (undefined4)CONCAT71(in_register_00000081,inclusive);
  (__return_storage_ptr__->super__Vector_base<Patch::Change,_std::allocator<Patch::Change>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Patch::Change,_std::allocator<Patch::Change>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Patch::Change,_std::allocator<Patch::Change>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8 = (vector<Patch::Change,std::allocator<Patch::Change>> *)__return_storage_ptr__;
  if (this->root != (Node *)0x0) {
    local_90 = end;
    local_88 = start;
    pNVar11 = splay_node_starting_before<Patch::OldCoordinates>(this,start);
    ppNVar3 = (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl
        .super__Vector_impl_data._M_finish != ppNVar3) {
      (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppNVar3;
    }
    pPVar14 = (this->left_ancestor_stack).
              super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->left_ancestor_stack).
        super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>.
        _M_impl.super__Vector_impl_data._M_finish != pPVar14) {
      (this->left_ancestor_stack).
      super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish = pPVar14;
    }
    Point::Point(&local_38);
    Point::Point(&local_40);
    local_80.old_start = local_38;
    local_80.old_end = local_40;
    local_80.new_start.row = 0;
    local_80.new_start.column = 0;
    iVar4._M_current =
         (this->left_ancestor_stack).
         super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (this->left_ancestor_stack).
        super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>::
      _M_realloc_insert<Patch::PositionStackEntry>
                (&this->left_ancestor_stack,iVar4,(PositionStackEntry *)&local_80);
    }
    else {
      (iVar4._M_current)->total_old_text_size = 0;
      (iVar4._M_current)->total_new_text_size = 0;
      (iVar4._M_current)->old_end = local_38;
      (iVar4._M_current)->new_end = local_40;
      ppPVar1 = &(this->left_ancestor_stack).
                 super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppPVar1 = *ppPVar1 + 1;
    }
    this_00 = &this->node_stack;
    local_e0 = this->root;
    if ((pNVar11 == (Node *)0x0) && (local_e0->left != (Node *)0x0)) {
      do {
        iVar5._M_current =
             (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Patch::Node*,std::allocator<Patch::Node*>>::
          _M_realloc_insert<Patch::Node*const&>
                    ((vector<Patch::Node*,std::allocator<Patch::Node*>> *)this_00,iVar5,&local_e0);
        }
        else {
          *iVar5._M_current = local_e0;
          pppNVar2 = &(this->node_stack).
                      super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppNVar2 = *pppNVar2 + 1;
        }
        local_e0 = local_e0->left;
      } while (local_e0->left != (Node *)0x0);
    }
    do {
      if (local_e0 == (Node *)0x0) {
        return (vector<Patch::Change,_std::allocator<Patch::Change>_> *)local_d8;
      }
      pPVar14 = (this->left_ancestor_stack).
                super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      local_98 = Point::traverse(&pPVar14[-1].old_end,&local_e0->old_distance_from_left_ancestor);
      local_a0 = Point::traverse(&pPVar14[-1].new_end,&local_e0->new_distance_from_left_ancestor);
      PVar12 = Point::traverse(&local_98,&local_e0->old_extent);
      local_a8 = Point::traverse(&local_a0,&local_e0->new_extent);
      pTVar6 = (local_e0->old_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>.
               _M_t.super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
               super__Head_base<0UL,_Text_*,_false>._M_head_impl;
      local_b8 = (local_e0->new_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>.
                 _M_t.super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
                 super__Head_base<0UL,_Text_*,_false>._M_head_impl;
      if (pTVar6 == (Text *)0x0) {
        local_80.old_text_size = local_e0->old_text_size_;
      }
      else {
        local_80.old_text_size = Text::size(pTVar6);
      }
      pNVar11 = local_e0->left;
      local_80.preceding_new_text_size = 0;
      local_ac = 0;
      if (pNVar11 != (Node *)0x0) {
        local_ac = pNVar11->old_subtree_text_size;
        local_80.preceding_new_text_size = pNVar11->new_subtree_text_size;
      }
      local_ac = local_ac + pPVar14[-1].total_old_text_size;
      local_80.preceding_new_text_size =
           local_80.preceding_new_text_size + pPVar14[-1].total_new_text_size;
      local_80.old_start = local_98;
      local_80.new_start = local_a0;
      local_80.new_end = local_a8;
      local_80.new_text = local_b8;
      local_b8 = (Text *)CONCAT44(local_b8._4_4_,local_80.preceding_new_text_size);
      local_80.old_end = PVar12;
      local_80.old_text = pTVar6;
      local_80.preceding_old_text_size = local_ac;
      if ((char)local_b0 == '\0') {
        local_d0.old_end = local_98;
        bVar8 = Point::operator>=(&local_d0.old_end,&local_90);
        bVar9 = true;
        if (!bVar8) {
          local_d0.old_end = local_80.old_end;
          bVar9 = Point::operator>(&local_d0.old_end,&local_88);
          goto LAB_0016f859;
        }
      }
      else {
        local_d0.old_end = local_98;
        bVar8 = Point::operator>(&local_d0.old_end,&local_90);
        bVar9 = true;
        if (!bVar8) {
          local_d0.old_end = local_80.old_end;
          bVar9 = Point::operator>=(&local_d0.old_end,&local_88);
LAB_0016f859:
          if (bVar9 != false) {
            __position._M_current = *(Change **)(local_d8 + 8);
            if (__position._M_current == *(Change **)(local_d8 + 0x10)) {
              std::vector<Patch::Change,std::allocator<Patch::Change>>::
              _M_realloc_insert<Patch::Change_const&>(local_d8,__position,&local_80);
            }
            else {
              (__position._M_current)->preceding_old_text_size = local_80.preceding_old_text_size;
              (__position._M_current)->preceding_new_text_size = local_80.preceding_new_text_size;
              *(ulong *)&(__position._M_current)->old_text_size =
                   CONCAT44(local_80._60_4_,local_80.old_text_size);
              (__position._M_current)->old_text = local_80.old_text;
              (__position._M_current)->new_text = local_80.new_text;
              (__position._M_current)->new_start = local_80.new_start;
              (__position._M_current)->new_end = local_80.new_end;
              (__position._M_current)->old_start = local_80.old_start;
              (__position._M_current)->old_end = local_80.old_end;
              *(Change **)(local_d8 + 8) = __position._M_current + 1;
            }
          }
          if (local_e0->right == (Node *)0x0) {
            ppNVar3 = (this->node_stack).
                      super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
            ppNVar13 = (this->node_stack).
                       super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            bVar9 = ppNVar3 == ppNVar13;
            if (!bVar9) {
              if (ppNVar13[-1]->right == local_e0) {
                pPVar14 = (this->left_ancestor_stack).
                          super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                pNVar11 = ppNVar13[-1];
                ppNVar7 = ppNVar13;
                do {
                  ppNVar13 = ppNVar7 + -1;
                  pPVar14 = pPVar14 + -1;
                  (this->node_stack).
                  super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
                  super__Vector_impl_data._M_finish = ppNVar13;
                  (this->left_ancestor_stack).
                  super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish = pPVar14;
                  bVar9 = ppNVar13 == ppNVar3;
                  if (bVar9) goto LAB_0016f934;
                  bVar8 = ppNVar7[-2]->right == pNVar11;
                  pNVar11 = ppNVar7[-2];
                  ppNVar7 = ppNVar13;
                } while (bVar8);
              }
              if (!bVar9) {
                local_e0 = ppNVar13[-1];
                (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>
                ._M_impl.super__Vector_impl_data._M_finish = ppNVar13 + -1;
                goto LAB_0016fa26;
              }
            }
LAB_0016f934:
            local_e0 = (Node *)0x0;
          }
          else {
            pTVar6 = (local_e0->old_text)._M_t.
                     super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
                     super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
                     super__Head_base<0UL,_Text_*,_false>._M_head_impl;
            if (pTVar6 == (Text *)0x0) {
              uVar10 = local_e0->old_text_size_;
            }
            else {
              uVar10 = Text::size(pTVar6);
            }
            pTVar6 = (local_e0->new_text)._M_t.
                     super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
                     super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
                     super__Head_base<0UL,_Text_*,_false>._M_head_impl;
            if (pTVar6 == (Text *)0x0) {
              local_d0.total_new_text_size = 0;
            }
            else {
              local_d0.total_new_text_size = Text::size(pTVar6);
            }
            local_d0.total_old_text_size = uVar10 + local_ac;
            local_d0.total_new_text_size = local_d0.total_new_text_size + (int)local_b8;
            local_d0.new_end = local_a8;
            iVar4._M_current =
                 (this->left_ancestor_stack).
                 super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_d0.old_end = PVar12;
            if (iVar4._M_current ==
                (this->left_ancestor_stack).
                super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>::
              _M_realloc_insert<Patch::PositionStackEntry>
                        (&this->left_ancestor_stack,iVar4,&local_d0);
            }
            else {
              (iVar4._M_current)->total_old_text_size = local_d0.total_old_text_size;
              (iVar4._M_current)->total_new_text_size = local_d0.total_new_text_size;
              (iVar4._M_current)->old_end = PVar12;
              (iVar4._M_current)->new_end = local_a8;
              ppPVar1 = &(this->left_ancestor_stack).
                         super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppPVar1 = *ppPVar1 + 1;
            }
            iVar5._M_current =
                 (this->node_stack).
                 super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<Patch::Node*,std::allocator<Patch::Node*>>::
              _M_realloc_insert<Patch::Node*const&>
                        ((vector<Patch::Node*,std::allocator<Patch::Node*>> *)this_00,iVar5,
                         &local_e0);
            }
            else {
              *iVar5._M_current = local_e0;
              pppNVar2 = &(this->node_stack).
                          super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              *pppNVar2 = *pppNVar2 + 1;
            }
            for (local_e0 = local_e0->right; local_e0->left != (Node *)0x0;
                local_e0 = local_e0->left) {
              iVar5._M_current =
                   (this->node_stack).
                   super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar5._M_current ==
                  (this->node_stack).
                  super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<Patch::Node*,std::allocator<Patch::Node*>>::
                _M_realloc_insert<Patch::Node*const&>
                          ((vector<Patch::Node*,std::allocator<Patch::Node*>> *)this_00,iVar5,
                           &local_e0);
              }
              else {
                *iVar5._M_current = local_e0;
                pppNVar2 = &(this->node_stack).
                            super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
                *pppNVar2 = *pppNVar2 + 1;
              }
            }
          }
LAB_0016fa26:
          bVar9 = false;
        }
      }
    } while (!bVar9);
  }
  return (vector<Patch::Change,_std::allocator<Patch::Change>_> *)local_d8;
}

Assistant:

vector<Change> Patch::grab_changes_in_range(Point start, Point end, bool inclusive) {
  vector<Change> result;
  if (!root)
    return result;

  Node *lower_bound = splay_node_starting_before<CoordinateSpace>(start);

  node_stack.clear();
  left_ancestor_stack.clear();
  left_ancestor_stack.push_back({Point(), Point(), 0, 0});

  Node *node = root;
  if (!lower_bound) {
    while (node->left) {
      node_stack.push_back(node);
      node = node->left;
    }
  }

  while (node) {
    Patch::PositionStackEntry &left_ancestor_info =
        left_ancestor_stack.back();
    Point old_start = left_ancestor_info.old_end.traverse(
        node->old_distance_from_left_ancestor);
    Point new_start = left_ancestor_info.new_end.traverse(
        node->new_distance_from_left_ancestor);

    Point old_end = old_start.traverse(node->old_extent);
    Point new_end = new_start.traverse(node->new_extent);
    Text *old_text = node->old_text.get();
    Text *new_text = node->new_text.get();
    uint32_t old_text_size = node->old_text_size();
    uint32_t preceding_old_text_size =
      left_ancestor_info.total_old_text_size + node->left_subtree_old_text_size();
    uint32_t preceding_new_text_size =
      left_ancestor_info.total_new_text_size + node->left_subtree_new_text_size();
    Change change{
      old_start,
      old_end,
      new_start,
      new_end,
      old_text,
      new_text,
      preceding_old_text_size,
      preceding_new_text_size,
      old_text_size,
    };

    if (inclusive) {
      if (CoordinateSpace::start(change) > end) {
        break;
      }

      if (CoordinateSpace::end(change) >= start) {
        result.push_back(change);
      }
    } else {
      if (CoordinateSpace::start(change) >= end) {
        break;
      }

      if (CoordinateSpace::end(change) > start) {
        result.push_back(change);
      }
    }

    if (node->right) {
      left_ancestor_stack.push_back(Patch::PositionStackEntry{
        old_end,
        new_end,
        preceding_old_text_size + node->old_text_size(),
        preceding_new_text_size + node->new_text_size()
      });
      node_stack.push_back(node);
      node = node->right;

      while (node->left) {
        node_stack.push_back(node);
        node = node->left;
      }
    } else {
      while (!node_stack.empty() && node_stack.back()->right == node) {
        node = node_stack.back();
        node_stack.pop_back();
        left_ancestor_stack.pop_back();
      }

      if (node_stack.empty()) {
        node = nullptr;
      } else {
        node = node_stack.back();
        node_stack.pop_back();
      }
    }
  }

  return result;
}